

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TArray<PFunction_*,_PFunction_*>::ShrinkToFit(TArray<PFunction_*,_PFunction_*> *this)

{
  uint uVar1;
  PFunction **ppPVar2;
  
  uVar1 = this->Count;
  if (uVar1 < this->Most) {
    this->Most = uVar1;
    if (uVar1 == 0) {
      if (this->Array == (PFunction **)0x0) {
        return;
      }
      M_Free(this->Array);
      ppPVar2 = (PFunction **)0x0;
    }
    else {
      ppPVar2 = (PFunction **)
                M_Realloc_Dbg(this->Array,(ulong)uVar1 << 3,
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                              ,0x1ad);
    }
    this->Array = ppPVar2;
  }
  return;
}

Assistant:

void ShrinkToFit ()
	{
		if (Most > Count)
		{
			Most = Count;
			if (Most == 0)
			{
				if (Array != NULL)
				{
					M_Free (Array);
					Array = NULL;
				}
			}
			else
			{
				DoResize ();
			}
		}
	}